

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O2

double __thiscall test::stdev_ts(test *this)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  double dVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  _Vector_base<double,_std::allocator<double>_> local_30;
  
  get_ts((vector<double,_std::allocator<double>_> *)&local_30,this);
  lVar2 = (long)local_30._M_impl.super__Vector_impl_data._M_finish -
          (long)local_30._M_impl.super__Vector_impl_data._M_start;
  uVar3 = lVar2 >> 3;
  dVar4 = 0.0;
  if (1 < uVar3) {
    dVar4 = avg<double>((vector<double,_std::allocator<double>_> *)&local_30);
    dVar5 = 0.0;
    for (; local_30._M_impl.super__Vector_impl_data._M_start !=
           local_30._M_impl.super__Vector_impl_data._M_finish;
        local_30._M_impl.super__Vector_impl_data._M_start =
             local_30._M_impl.super__Vector_impl_data._M_start + 1) {
      dVar5 = dVar5 + *local_30._M_impl.super__Vector_impl_data._M_start *
                      *local_30._M_impl.super__Vector_impl_data._M_start;
    }
    lVar1 = uVar3 - 1;
    auVar8._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar8._0_8_ = lVar1;
    auVar8._12_4_ = 0x45300000;
    dVar7 = (double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0;
    dVar10 = auVar8._8_8_ - 1.9342813113834067e+25;
    auVar11._8_4_ = (int)(lVar2 >> 0x23);
    auVar11._0_8_ = uVar3;
    auVar11._12_4_ = 0x45300000;
    auVar6._8_8_ = ((auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) * dVar4 * dVar4;
    auVar6._0_8_ = dVar5;
    auVar9._0_8_ = dVar7 + dVar10;
    auVar9._8_8_ = dVar7 + dVar10;
    auVar6 = divpd(auVar6,auVar9);
    dVar4 = auVar6._0_8_ - auVar6._8_8_;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_30);
  return dVar4;
}

Assistant:

double stdev_ts() const { return ::stdev(get_ts()); }